

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O2

void VP8LConvertBGRAToRGB565_C(uint32_t *src,int num_pixels,uint8_t *dst)

{
  uint *puVar1;
  uint uVar2;
  
  puVar1 = src + num_pixels;
  for (; src < puVar1; src = src + 1) {
    uVar2 = *src;
    *dst = (byte)(uVar2 >> 0xd) & 7 | (byte)(uVar2 >> 0x10) & 0xf8;
    dst[1] = (byte)(uVar2 >> 3) & 0x1f | (byte)(uVar2 >> 5) & 0xe0;
    dst = dst + 2;
  }
  return;
}

Assistant:

void VP8LConvertBGRAToRGB565_C(const uint32_t* src,
                               int num_pixels, uint8_t* dst) {
  const uint32_t* const src_end = src + num_pixels;
  while (src < src_end) {
    const uint32_t argb = *src++;
    const uint8_t rg = ((argb >> 16) & 0xf8) | ((argb >> 13) & 0x7);
    const uint8_t gb = ((argb >>  5) & 0xe0) | ((argb >>  3) & 0x1f);
#if (WEBP_SWAP_16BIT_CSP == 1)
    *dst++ = gb;
    *dst++ = rg;
#else
    *dst++ = rg;
    *dst++ = gb;
#endif
  }
}